

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

FuncInfo *
PreVisitFunction(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,
                ParseableFunctionInfo *reuseNestedFunc)

{
  undefined1 *puVar1;
  Type *pTVar2;
  ushort uVar3;
  FncFlags FVar4;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this;
  IdentPtr pIVar5;
  Utf8SourceInfo *pUVar6;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  Type *ppFVar10;
  ParseNodeFnc *pPVar11;
  size_t sVar12;
  undefined4 *puVar13;
  FuncInfo *func;
  FunctionBody *pFVar14;
  ParseNode *this_00;
  ArgSlot AVar15;
  uint32 nameLength;
  uint32 shortNameOffset;
  byte bVar16;
  Type this_01;
  char16 *string;
  bool local_31 [8];
  bool funcExprWithName;
  
  this = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this) {
    this_01 = (FuncInfo *)0x0;
  }
  else {
    ppFVar10 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    this_01 = *ppFVar10;
  }
  shortNameOffset = 0;
  bVar8 = false;
  if ((byteCodeGenerator->flags & 0x1000) == 0) {
    bVar8 = FuncInfo::IsGlobalFunction(this_01);
    if (bVar8) {
      pPVar11 = (ParseNodeFnc *)ParseNodeFnc::GetParamScope(this_01->root);
      bVar8 = pPVar11 == pnodeFnc;
    }
    else {
      bVar8 = false;
    }
  }
  local_31[0] = false;
  string = pnodeFnc->hint;
  if (string == (char16_t *)0x0) {
    string = L"Anonymous function";
    nameLength = 0x12;
  }
  else {
    nameLength = pnodeFnc->hintLength;
    shortNameOffset = pnodeFnc->hintOffset;
    if (nameLength == 0) {
      sVar12 = PAL_wcslen(string);
      nameLength = 0;
      if ((int)sVar12 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x9b3,
                           "(funcNameLength != 0 || funcNameLength == (int)PAL_wcslen(funcName))",
                           "funcNameLength != 0 || funcNameLength == (int)wcslen(funcName)");
        if (!bVar9) goto LAB_008357e4;
        *puVar13 = 0;
      }
    }
  }
  FVar4 = pnodeFnc->fncFlags;
  if ((FVar4 & (kFunctionIsMethod|kFunctionDeclaration)) == kFunctionNone) {
    if (pnodeFnc->pnodeName == (ParseNodeVar *)0x0) {
      if ((FVar4 >> 10 & 1) == 0) goto LAB_00835437;
      string = L"Module code";
      nameLength = 0xb;
    }
    else {
      if ((pnodeFnc->pnodeName->super_ParseNode).nop != knopVarDecl) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x9c1,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                           "pnodeFnc->pnodeName->nop == knopVarDecl");
        if (!bVar9) goto LAB_008357e4;
        *puVar13 = 0;
      }
      pIVar5 = pnodeFnc->pnodeName->pid;
      nameLength = pIVar5->m_cch;
      string = (char16 *)&pIVar5->field_0x22;
      local_31[0] = true;
    }
    shortNameOffset = 0;
  }
  else {
    pIVar5 = pnodeFnc->pid;
    if ((FVar4 >> 0x14 & 1) == 0 && pIVar5 != (IdentPtr)0x0) {
      nameLength = pIVar5->m_cch;
      string = (char16 *)&pIVar5->field_0x22;
      shortNameOffset = 0;
    }
  }
LAB_00835437:
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ByteCodePhase);
  if (bVar9) {
    Output::Print(L"function start %s\n",string);
  }
  if (pnodeFnc->funcInfo != (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x9d6,"(pnodeFnc->funcInfo == nullptr)","pnodeFnc->funcInfo == nullptr");
    if (!bVar9) {
LAB_008357e4:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar13 = 0;
  }
  func = ByteCodeGenerator::StartBindFunction
                   (byteCodeGenerator,string,nameLength,shortNameOffset,local_31,pnodeFnc,
                    reuseNestedFunc);
  pnodeFnc->funcInfo = func;
  *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 =
       *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 & 0xffdf |
       (ushort)local_31[0] << 5;
  *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 =
       *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 & 0xffbf |
       (ushort)pnodeFnc->isNameIdentifierRef << 6;
  if (bVar8) {
    ByteCodeGenerator::SetRootFuncInfo(byteCodeGenerator,func);
  }
  if (pnodeFnc->pnodeBody == (ParseNodePtr)0x0) {
    this_00 = pnodeFnc->pnodeParams;
    AVar15 = 1;
    while( true ) {
      if (this_00 == (ParseNode *)0x0) {
        ppFVar10 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&byteCodeGenerator->funcInfoStack->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        (*ppFVar10)->inArgsCount = AVar15;
        return func;
      }
      if (AVar15 == 0xffff) break;
      this_00 = ParseNode::GetFormalNext(this_00);
      AVar15 = AVar15 + 1;
    }
    Math::DefaultOverflowPolicy();
  }
  FVar4 = pnodeFnc->fncFlags;
  if ((FVar4 & kFunctionHasReferenceableBuiltInArguments) == kFunctionNone) goto LAB_00835710;
  if ((FVar4 & kFunctionCallsEval) == kFunctionNone) {
    if ((FVar4 & kFunctionUsesArguments) == kFunctionNone) goto LAB_00835710;
    func->field_0xb4 = func->field_0xb4 | 8;
    pFVar14 = FuncInfo::GetParsedFunctionBody(func);
    uVar3 = *(ushort *)&(pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
    if (-1 < (short)uVar3) {
      *(ushort *)&(pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
           uVar3 | 0x8000;
    }
    bVar16 = 1;
    if ((int)pnodeFnc->fncFlags < 0) {
      bVar16 = (func->byteCodeFunction->super_FunctionProxy).field_0x46 & 1;
    }
    bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,PerfHintPhase);
    if ((bVar16 == 0) && (bVar8)) {
      pFVar14 = FuncInfo::GetParsedFunctionBody(func);
      WritePerfHint(HeapArgumentsDueToWriteToFormals,pFVar14,0);
    }
    if (((bVar16 != 0) && (1 < pnodeFnc->funcInfo->paramScope->m_count)) &&
       ((((byteCodeGenerator->flags & 0x400) != 0 ||
         ((pnodeFnc->fncFlags & kFunctionHasWithStmt) != kFunctionNone)) ||
        ((((pUVar6 = byteCodeGenerator->m_utf8SourceInfo,
           (pUVar6->debugModeSource).ptr != (uchar *)0x0 || ((pUVar6->field_0xa8 & 0x20) != 0)) &&
          ((pUVar6->field_0xa8 & 0x40) != 0)) ||
         ((bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,StackArgFormalsOptPhase), bVar8 ||
          (bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,StackArgOptPhase), bVar8)))))))) {
      bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,PerfHintPhase);
      if (bVar8) {
        if ((pnodeFnc->fncFlags & kFunctionHasWithStmt) != kFunctionNone) {
          pFVar14 = FuncInfo::GetParsedFunctionBody(func);
          WritePerfHint(HasWithBlock,pFVar14,0);
        }
        if ((byteCodeGenerator->flags & 0x400) != 0) {
          pFVar14 = FuncInfo::GetParsedFunctionBody(func);
          bVar16 = 0;
          WritePerfHint(SrcIsEval,pFVar14,0);
          goto LAB_00835791;
        }
      }
      bVar16 = 0;
    }
LAB_00835791:
    FVar4 = pnodeFnc->fncFlags;
    *(uint *)&func->field_0xb4 = *(uint *)&func->field_0xb4 | 0x10;
    *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 =
         *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 & 0xdfff |
         (ushort)((FVar4 & (kFunctionIsAsync|kFunctionIsGenerator)) == kFunctionNone & bVar16) <<
         0xd;
    AVar15 = func->inArgsCount;
  }
  else {
    func->field_0xb4 = func->field_0xb4 | 0x18;
    puVar1 = &(func->byteCodeFunction->super_FunctionProxy).field_0x45;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xdfff;
    AVar15 = func->inArgsCount;
  }
  if (AVar15 == 0) {
    ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
  }
LAB_00835710:
  pFVar14 = FuncInfo::GetParsedFunctionBody(this_01);
  if (((func->field_0xb4 & 8) != 0) ||
     (((pFVar14->super_ParseableFunctionInfo).flags & Flags_HasOrParentHasArguments) != Flags_None))
  {
    pFVar14 = FuncInfo::GetParsedFunctionBody(func);
    pTVar2 = &(pFVar14->super_ParseableFunctionInfo).flags;
    *pTVar2 = *pTVar2 | Flags_HasOrParentHasArguments;
  }
  PreVisitBlock(pnodeFnc->pnodeScopes,byteCodeGenerator);
  bVar8 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,func,func->root);
  AddArgsToScope(pnodeFnc,byteCodeGenerator,!bVar8);
  return func;
}

Assistant:

FuncInfo* PreVisitFunction(ParseNodeFnc* pnodeFnc, ByteCodeGenerator* byteCodeGenerator, Js::ParseableFunctionInfo *reuseNestedFunc)
{
    // Do binding of function name(s), initialize function scope, propagate function-wide properties from
    // the parent (if any).
    FuncInfo* parentFunc = byteCodeGenerator->TopFuncInfo();

    // fIsRoot indicates that this is the root function to be returned to a ParseProcedureText/AddScriptLet/etc. call.
    // In such cases, the global function is just a wrapper around the root function's declaration.
    // We used to assert that this was the only top-level function body, but it's possible to trick
    // "new Function" into compiling more than one function (see WOOB 1121759).
    bool fIsRoot = (!(byteCodeGenerator->GetFlags() & fscrGlobalCode) &&
        parentFunc->IsGlobalFunction() &&
        parentFunc->root->GetTopLevelScope() == pnodeFnc);

    const char16 *funcName = Js::Constants::AnonymousFunction;
    uint funcNameLength = Js::Constants::AnonymousFunctionLength;
    uint functionNameOffset = 0;
    bool funcExprWithName = false;

    if (pnodeFnc->hint != nullptr)
    {
        funcName = reinterpret_cast<const char16*>(pnodeFnc->hint);
        funcNameLength = pnodeFnc->hintLength;
        functionNameOffset = pnodeFnc->hintOffset;
        Assert(funcNameLength != 0 || funcNameLength == (int)wcslen(funcName));
    }
    if (pnodeFnc->IsDeclaration() || pnodeFnc->IsMethod())
    {
        // Class members have the fully qualified name stored in 'hint', no need to replace it.
        if (pnodeFnc->pid && !pnodeFnc->IsClassMember())
        {
            funcName = reinterpret_cast<const char16*>(pnodeFnc->pid->Psz());
            funcNameLength = pnodeFnc->pid->Cch();
            functionNameOffset = 0;
        }
    }
    else if (pnodeFnc->pnodeName != nullptr)
    {
        Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
        funcName = reinterpret_cast<const char16*>(pnodeFnc->pnodeName->pid->Psz());
        funcNameLength = pnodeFnc->pnodeName->pid->Cch();
        functionNameOffset = 0;
        //
        // create the new scope for Function expression only in ES5 mode
        //
        funcExprWithName = true;
    }
    else if (pnodeFnc->IsModule())
    {
        funcName = Js::Constants::ModuleCode;
        funcNameLength = Js::Constants::ModuleCodeLength;
        functionNameOffset = 0;
    }

    if (byteCodeGenerator->Trace())
    {
        Output::Print(_u("function start %s\n"), funcName);
    }

    Assert(pnodeFnc->funcInfo == nullptr);
    FuncInfo* funcInfo = pnodeFnc->funcInfo = byteCodeGenerator->StartBindFunction(funcName, funcNameLength, functionNameOffset, &funcExprWithName, pnodeFnc, reuseNestedFunc);
    funcInfo->byteCodeFunction->SetIsNamedFunctionExpression(funcExprWithName);
    funcInfo->byteCodeFunction->SetIsNameIdentifierRef(pnodeFnc->isNameIdentifierRef);

    if (fIsRoot)
    {
        byteCodeGenerator->SetRootFuncInfo(funcInfo);
    }

    if (pnodeFnc->pnodeBody == nullptr)
    {
        // This is a deferred byte code gen, so we're done.
        // Process the formal arguments, even if there's no AST for the body, to support Function.length.
        Js::ArgSlot pos = 1;
        // We skip the rest parameter here because it is not counted towards the in arg count.
        MapFormalsWithoutRest(pnodeFnc, [&](ParseNode *pnode) { ArgSlotMath::Inc(pos); });
        byteCodeGenerator->SetNumberOfInArgs(pos);
        return funcInfo;
    }

    if (pnodeFnc->HasReferenceableBuiltInArguments())
    {
        // The parser identified that there is a way to reference the built-in 'arguments' variable from this function. So, we
        // need to determine whether we need to create the variable or not. We need to create the variable iff:
        if (pnodeFnc->CallsEval())
        {
            // 1. eval is called.
            // 2. when the debugging is enabled, since user can seek arguments during breakpoint.
            funcInfo->SetHasArguments(true);
            funcInfo->SetHasHeapArguments(true);
            if (funcInfo->inArgsCount == 0)
            {
                // If no formals to function, no need to create the propertyid array
                byteCodeGenerator->AssignNullConstRegister();
            }
        }
        else if (pnodeFnc->UsesArguments())
        {
            // 3. the function directly references an 'arguments' identifier
            funcInfo->SetHasArguments(true);
            funcInfo->GetParsedFunctionBody()->SetUsesArgumentsObject(true);
            if (pnodeFnc->HasHeapArguments())
            {
                bool doStackArgsOpt = (!pnodeFnc->HasAnyWriteToFormals() || funcInfo->GetIsStrictMode());
#ifdef PERF_HINT
                if (PHASE_TRACE1(Js::PerfHintPhase) && !doStackArgsOpt)
                {
                    WritePerfHint(PerfHints::HeapArgumentsDueToWriteToFormals, funcInfo->GetParsedFunctionBody(), 0);
                }
#endif

                //With statements - need scope object to be present.
                if ((doStackArgsOpt && pnodeFnc->funcInfo->GetParamScope()->Count() > 1) && ((byteCodeGenerator->GetFlags() & fscrEval) ||
                    pnodeFnc->HasWithStmt() || byteCodeGenerator->IsInDebugMode() || PHASE_OFF1(Js::StackArgFormalsOptPhase) || PHASE_OFF1(Js::StackArgOptPhase)))
                {
                    doStackArgsOpt = false;
#ifdef PERF_HINT
                    if (PHASE_TRACE1(Js::PerfHintPhase))
                    {
                        if (pnodeFnc->HasWithStmt())
                        {
                            WritePerfHint(PerfHints::HasWithBlock, funcInfo->GetParsedFunctionBody(), 0);
                        }

                        if(byteCodeGenerator->GetFlags() & fscrEval)
                        {
                            WritePerfHint(PerfHints::SrcIsEval, funcInfo->GetParsedFunctionBody(), 0);
                        }
                    }
#endif
                }
                funcInfo->SetHasHeapArguments(true, !pnodeFnc->IsCoroutine() && doStackArgsOpt /*= Optimize arguments in backend*/);
                if (funcInfo->inArgsCount == 0)
                {
                    // If no formals to function, no need to create the propertyid array
                    byteCodeGenerator->AssignNullConstRegister();
                }
            }
        }
    }

    Js::FunctionBody* parentFunctionBody = parentFunc->GetParsedFunctionBody();
    if (funcInfo->GetHasArguments() ||
        parentFunctionBody->GetHasOrParentHasArguments())
    {
        // The JIT uses this info, for instance, to narrow kills of array operations
        funcInfo->GetParsedFunctionBody()->SetHasOrParentHasArguments(true);
    }
    PreVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
    // If we have arguments, we are going to need locations if the function is in strict mode or we have a non-simple parameter list. This is because we will not create a scope object.
    bool assignLocationForFormals = !byteCodeGenerator->NeedScopeObjectForArguments(funcInfo, funcInfo->root);
    AddArgsToScope(pnodeFnc, byteCodeGenerator, assignLocationForFormals);

    return funcInfo;
}